

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decompiler.cc
# Opt level: O1

Value * __thiscall
wabt::Decompiler::WrapBinary
          (Value *__return_storage_ptr__,Decompiler *this,
          vector<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_> *args,
          string_view infix,bool indent_right,Precedence precedence)

{
  Value *val;
  pointer pbVar1;
  pointer pbVar2;
  _Alloc_hider _Var3;
  ulong uVar4;
  long *plVar5;
  long lVar6;
  pointer pbVar7;
  ulong uVar8;
  pointer pbVar9;
  pointer pbVar10;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2_1;
  string s_2;
  undefined1 local_88 [24];
  long lStack_70;
  undefined1 *local_68;
  undefined8 local_60;
  undefined1 local_58 [16];
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  
  val = (args->super__Vector_base<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>
        )._M_impl.super__Vector_impl_data._M_start;
  if ((long)(args->
            super__Vector_base<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>).
            _M_impl.super__Vector_impl_data._M_finish - (long)val == 0x40) {
    BracketIfNeeded(this,val,precedence);
    BracketIfNeeded(this,val + 1,precedence);
    pbVar1 = (val->v).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    uVar4 = 0;
    pbVar10 = (val->v).
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    for (pbVar7 = pbVar10; pbVar7 != pbVar1; pbVar7 = pbVar7 + 1) {
      if (uVar4 <= pbVar7->_M_string_length) {
        uVar4 = pbVar7->_M_string_length;
      }
    }
    pbVar2 = val[1].v.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    uVar8 = 0;
    pbVar7 = val[1].v.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    for (pbVar9 = pbVar7; pbVar9 != pbVar2; pbVar9 = pbVar9 + 1) {
      if (uVar8 <= pbVar9->_M_string_length) {
        uVar8 = pbVar9->_M_string_length;
      }
    }
    if ((((long)pbVar2 - (long)pbVar7 == 0x20) && ((long)pbVar1 - (long)pbVar10 == 0x20)) &&
       (uVar4 + infix.size_ + uVar8 < this->target_exp_width)) {
      _Var3._M_p = (((val->v).
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p;
      local_68 = local_58;
      local_60 = 0;
      local_58[0] = 0;
      std::__cxx11::string::reserve((ulong)&local_68);
      std::__cxx11::string::append((char *)&local_68,(ulong)_Var3._M_p);
      std::__cxx11::string::append((char *)&local_68,(ulong)infix.data_);
      plVar5 = (long *)std::__cxx11::string::_M_append
                                 ((char *)&local_68,
                                  (ulong)((val[1].v.
                                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus).
                                         _M_p);
      pbVar10 = (pointer)(plVar5 + 2);
      if ((pointer)*plVar5 == pbVar10) {
        local_88._16_8_ = (pbVar10->_M_dataplus)._M_p;
        lStack_70 = plVar5[3];
        local_88._0_8_ = (pointer)(local_88 + 0x10);
      }
      else {
        local_88._16_8_ = (pbVar10->_M_dataplus)._M_p;
        local_88._0_8_ = (pointer)*plVar5;
      }
      local_88._8_8_ = plVar5[1];
      *plVar5 = (long)pbVar10;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      local_38 = 0;
      local_48 = 0;
      uStack_40 = 0;
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      _M_range_initialize<std::__cxx11::string_const*>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_48,
                 local_88);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&__return_storage_ptr__->v,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&local_48);
      __return_storage_ptr__->precedence = precedence;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_48);
      if ((pointer)local_88._0_8_ != (pointer)(local_88 + 0x10)) {
        operator_delete((void *)local_88._0_8_);
      }
      if (local_68 != local_58) {
        operator_delete(local_68);
      }
    }
    else {
      local_88._0_8_ = (pointer)0x0;
      local_88._8_8_ = (pointer)0x0;
      local_88._16_8_ = (pointer)0x0;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&__return_storage_ptr__->v,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_88);
      __return_storage_ptr__->precedence = precedence;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_88);
      pbVar10 = (val->v).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      lVar6 = (long)(val->v).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar10 >> 5;
      if (0 < lVar6) {
        lVar6 = lVar6 + 1;
        do {
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                     __return_storage_ptr__,pbVar10);
          pbVar10 = pbVar10 + 1;
          lVar6 = lVar6 + -1;
        } while (1 < lVar6);
      }
      std::__cxx11::string::append
                ((char *)((__return_storage_ptr__->v).
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish + -1),(ulong)infix.data_);
      if (indent_right) {
        IndentValue(this,val + 1,this->indent_amount,(string_view)ZEXT816(0));
      }
      pbVar10 = val[1].v.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      lVar6 = (long)val[1].v.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar10 >> 5;
      if (0 < lVar6) {
        lVar6 = lVar6 + 1;
        do {
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                     __return_storage_ptr__,pbVar10);
          pbVar10 = pbVar10 + 1;
          lVar6 = lVar6 + -1;
        } while (1 < lVar6);
      }
    }
    return __return_storage_ptr__;
  }
  __assert_fail("args.size() == 2",
                "/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/decompiler.cc"
                ,0x93,
                "Value wabt::Decompiler::WrapBinary(std::vector<Value> &, string_view, bool, Precedence)"
               );
}

Assistant:

Value WrapBinary(std::vector<Value>& args, string_view infix,
                   bool indent_right, Precedence precedence) {
    assert(args.size() == 2);
    auto& left = args[0];
    auto& right = args[1];
    BracketIfNeeded(left, precedence);
    BracketIfNeeded(right, precedence);
    auto width = infix.size() + left.width() + right.width();
    if (width < target_exp_width && left.v.size() == 1 && right.v.size() == 1) {
      return Value{{left.v[0] + infix + right.v[0]}, precedence};
    } else {
      Value bin { {}, precedence };
      std::move(left.v.begin(), left.v.end(), std::back_inserter(bin.v));
      bin.v.back().append(infix.data(), infix.size());
      if (indent_right) IndentValue(right, indent_amount, {});
      std::move(right.v.begin(), right.v.end(), std::back_inserter(bin.v));
      return bin;
    }
  }